

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadMessageNoVirtual<CoreML::Specification::SizeRange>
               (CodedInputStream *input,SizeRange *value)

{
  bool bVar1;
  pair<int,_int> pVar2;
  int length;
  int local_1c;
  
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&local_1c);
  if (((bVar1) &&
      (pVar2 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,local_1c),
      -1 < (long)pVar2)) &&
     (bVar1 = CoreML::Specification::SizeRange::MergePartialFromCodedStream(value,input), bVar1)) {
    bVar1 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar2.first);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessageNoVirtual(
    io::CodedInputStream* input, MessageType_WorkAroundCppLookupDefect* value) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  std::pair<io::CodedInputStream::Limit, int> p =
      input->IncrementRecursionDepthAndPushLimit(length);
  if (p.second < 0 || !value->
      MessageType_WorkAroundCppLookupDefect::MergePartialFromCodedStream(input))
    return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  return input->DecrementRecursionDepthAndPopLimit(p.first);
}